

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Select * sqlite3SelectNew(Parse *pParse,ExprList *pEList,SrcList *pSrc,Expr *pWhere,
                         ExprList *pGroupBy,Expr *pHaving,ExprList *pOrderBy,u32 selFlags,
                         Expr *pLimit)

{
  Select *pSVar1;
  Expr *pExpr;
  Select *pSVar2;
  u32 uVar3;
  Select *p;
  Select standin;
  Token local_c0;
  Select local_b0;
  
  pSVar1 = (Select *)sqlite3DbMallocRawNN(pParse->db,0x80);
  p = pSVar1;
  if (pSVar1 == (Select *)0x0) {
    p = &local_b0;
  }
  if (pEList == (ExprList *)0x0) {
    local_c0.z = (char *)0x0;
    local_c0.n = 0;
    pExpr = sqlite3ExprAlloc(pParse->db,0xac,&local_c0,0);
    pEList = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pExpr);
  }
  p->pEList = pEList;
  pSVar2 = pSVar1;
  if (pSVar1 == (Select *)0x0) {
    pSVar2 = &local_b0;
  }
  pSVar2->op = 0x83;
  pSVar2->selFlags = selFlags;
  pSVar2->iLimit = 0;
  pSVar2->iOffset = 0;
  uVar3 = pParse->nSelect + 1;
  pParse->nSelect = uVar3;
  pSVar2->selId = uVar3;
  pSVar2->addrOpenEphm[0] = -1;
  pSVar2->addrOpenEphm[1] = -1;
  pSVar2->nSelectRow = 0;
  if (pSrc == (SrcList *)0x0) {
    pSrc = (SrcList *)sqlite3DbMallocZero(pParse->db,0x78);
  }
  if (pSVar1 == (Select *)0x0) {
    pSVar1 = &local_b0;
  }
  pSVar1->pSrc = pSrc;
  pSVar1->pWhere = pWhere;
  pSVar1->pGroupBy = pGroupBy;
  pSVar1->pHaving = pHaving;
  pSVar1->pOrderBy = pOrderBy;
  pSVar1->pPrior = (Select *)0x0;
  pSVar1->pNext = (Select *)0x0;
  pSVar1->pLimit = pLimit;
  pSVar1->pWith = (With *)0x0;
  pSVar1->pWin = (Window *)0x0;
  pSVar1->pWinDefn = (Window *)0x0;
  if (pParse->db->mallocFailed != '\0') {
    clearSelect(pParse->db,p,(uint)(p != &local_b0));
    p = (Select *)0x0;
  }
  return p;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectNew(
  Parse *pParse,        /* Parsing context */
  ExprList *pEList,     /* which columns to include in the result */
  SrcList *pSrc,        /* the FROM clause -- which tables to scan */
  Expr *pWhere,         /* the WHERE clause */
  ExprList *pGroupBy,   /* the GROUP BY clause */
  Expr *pHaving,        /* the HAVING clause */
  ExprList *pOrderBy,   /* the ORDER BY clause */
  u32 selFlags,         /* Flag parameters, such as SF_Distinct */
  Expr *pLimit          /* LIMIT value.  NULL means not used */
){
  Select *pNew;
  Select standin;
  pNew = sqlite3DbMallocRawNN(pParse->db, sizeof(*pNew) );
  if( pNew==0 ){
    assert( pParse->db->mallocFailed );
    pNew = &standin;
  }
  if( pEList==0 ){
    pEList = sqlite3ExprListAppend(pParse, 0,
                                   sqlite3Expr(pParse->db,TK_ASTERISK,0));
  }
  pNew->pEList = pEList;
  pNew->op = TK_SELECT;
  pNew->selFlags = selFlags;
  pNew->iLimit = 0;
  pNew->iOffset = 0;
  pNew->selId = ++pParse->nSelect;
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  pNew->nSelectRow = 0;
  if( pSrc==0 ) pSrc = sqlite3DbMallocZero(pParse->db, sizeof(*pSrc));
  pNew->pSrc = pSrc;
  pNew->pWhere = pWhere;
  pNew->pGroupBy = pGroupBy;
  pNew->pHaving = pHaving;
  pNew->pOrderBy = pOrderBy;
  pNew->pPrior = 0;
  pNew->pNext = 0;
  pNew->pLimit = pLimit;
  pNew->pWith = 0;
#ifndef SQLITE_OMIT_WINDOWFUNC
  pNew->pWin = 0;
  pNew->pWinDefn = 0;
#endif
  if( pParse->db->mallocFailed ) {
    clearSelect(pParse->db, pNew, pNew!=&standin);
    pNew = 0;
  }else{
    assert( pNew->pSrc!=0 || pParse->nErr>0 );
  }
  assert( pNew!=&standin );
  return pNew;
}